

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O1

void __thiscall CP::queue<int>::expand(queue<int> *this,size_t capacity)

{
  size_t sVar1;
  int *piVar2;
  size_t sVar3;
  int *__s;
  size_t sVar4;
  ulong uVar5;
  
  uVar5 = -(ulong)(capacity >> 0x3e != 0) | capacity * 4;
  __s = (int *)operator_new__(uVar5);
  memset(__s,0,uVar5);
  sVar1 = this->mSize;
  if (sVar1 != 0) {
    piVar2 = this->mData;
    uVar5 = this->mCap;
    sVar3 = this->mFront;
    sVar4 = 0;
    do {
      __s[sVar4] = piVar2[(sVar3 + sVar4) % uVar5];
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  if (this->mData != (int *)0x0) {
    operator_delete__(this->mData);
  }
  this->mData = __s;
  this->mCap = capacity;
  this->mFront = 0;
  return;
}

Assistant:

void expand(size_t capacity) {
      T *arr = new T[capacity]();
      for (size_t i = 0;i < mSize;i++) {
        arr[i] = mData[(mFront + i) % mCap];
      }
      delete [] mData;
      mData = arr;
      mCap = capacity;
      mFront = 0;
    }